

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Builder * __thiscall
kj::_::NullableValue<capnp::schema::Field::Builder>::emplace<capnp::schema::Field::Builder&>
          (NullableValue<capnp::schema::Field::Builder> *this,Builder *params)

{
  Builder *params_00;
  Builder *params_local;
  NullableValue<capnp::schema::Field::Builder> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<capnp::schema::Field::Builder>(&(this->field_1).value);
  }
  params_00 = fwd<capnp::schema::Field::Builder&>(params);
  ctor<capnp::schema::Field::Builder,capnp::schema::Field::Builder&>
            (&(this->field_1).value,params_00);
  this->isSet = true;
  return (Builder *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }